

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

type * __thiscall
duckdb::Deserializer::Read<duckdb::vector<duckdb::DataPointer,true>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  DataPointer val;
  DataPointer local_b0;
  
  (__return_storage_ptr__->super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>).
  super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>).
  super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>).
  super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*this->_vptr_Deserializer[8])(this);
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 != 0) {
    do {
      (*this->_vptr_Deserializer[6])(this);
      DataPointer::Deserialize(&local_b0,this);
      (*this->_vptr_Deserializer[7])(this);
      ::std::vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>::
      emplace_back<duckdb::DataPointer>
                (&__return_storage_ptr__->
                  super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>,&local_b0)
      ;
      if (local_b0.segment_state.
          super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
          .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_b0.segment_state.
                              super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
                              .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>.
                              _M_head_impl + 8))();
      }
      local_b0.segment_state.
      super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
      .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
           )(__uniq_ptr_data<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true,_true>
             )0x0;
      BaseStatistics::~BaseStatistics(&local_b0.statistics);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_vector<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_vector<T>::ELEMENT_TYPE;
		T vec;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			vec.push_back(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return vec;
	}